

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void __thiscall capnp::_::StructBuilder::copyContentFrom(StructBuilder *this,StructReader other)

{
  bool bVar1;
  uint uVar2;
  unsigned_short *puVar3;
  byte *ptr;
  bool local_9b;
  bool local_9a;
  bool local_99;
  Iterator local_70;
  Iterator local_6e;
  Range<unsigned_short> RStack_6c;
  unsigned_short i_1;
  Iterator __end2_1;
  Iterator __begin2_1;
  Range<unsigned_short> *__range2_1;
  Iterator local_58;
  Iterator local_56;
  Range<unsigned_short> RStack_54;
  unsigned_short i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_short> *__range2;
  byte *local_40;
  byte *unshared;
  Fault local_28;
  Fault f;
  DebugExpression local_18;
  bool local_17;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_short_&>_> local_16;
  uint local_14;
  bool _kjCondition;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_short_&>_> sharedPointerCount;
  StructBuilder *pSStack_10;
  WiderType<Decay<unsigned_int_&>,_Decay<unsigned_int_&>_> sharedDataSize;
  StructBuilder *this_local;
  
  pSStack_10 = this;
  local_14 = kj::min<unsigned_int&,unsigned_int&>(&this->dataSize,&other.dataSize);
  local_16 = kj::min<unsigned_short&,unsigned_short&>(&this->pointerCount,&other.pointerCount);
  if (((local_14 == 0) || (other.data != this->data)) &&
     ((local_16 == 0 || (other.pointers != this->pointers)))) {
    if (local_14 < this->dataSize) {
      if (this->dataSize == 1) {
        setDataField<bool>(this,0,false);
      }
      else {
        ptr = (byte *)((long)this->data + (ulong)(local_14 >> 3));
        local_40 = ptr;
        uVar2 = subtractChecked<unsigned_int,unsigned_int,capnp::_::StructBuilder::copyContentFrom(capnp::_::StructReader)::__0>
                          (this->dataSize,local_14,(anon_class_1_0_00000001 *)((long)&__range2 + 7))
        ;
        WireHelpers::zeroMemory(ptr,uVar2 >> 3);
      }
    }
    if (local_14 == 1) {
      bVar1 = StructReader::getDataField<bool>(&other,0);
      setDataField<bool>(this,0,bVar1);
    }
    else {
      WireHelpers::copyMemory((byte *)this->data,(byte *)other.data,local_14 >> 3);
    }
    RStack_54 = kj::zeroTo<unsigned_short>(this->pointerCount);
    ___end2 = &stack0xffffffffffffffac;
    local_56 = kj::Range<unsigned_short>::begin(___end2);
    local_58 = kj::Range<unsigned_short>::end(___end2);
    while (bVar1 = kj::Range<unsigned_short>::Iterator::operator==(&local_56,&local_58),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar3 = kj::Range<unsigned_short>::Iterator::operator*(&local_56);
      WireHelpers::zeroObject(this->segment,this->capTable,this->pointers + (int)(uint)*puVar3);
      kj::Range<unsigned_short>::Iterator::operator++(&local_56);
    }
    WireHelpers::zeroMemory(this->pointers,(uint)this->pointerCount);
    RStack_6c = kj::zeroTo<unsigned_short>(local_16);
    ___end2_1 = &stack0xffffffffffffff94;
    local_6e = kj::Range<unsigned_short>::begin(___end2_1);
    local_70 = kj::Range<unsigned_short>::end(___end2_1);
    while (bVar1 = kj::Range<unsigned_short>::Iterator::operator==(&local_6e,&local_70),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar3 = kj::Range<unsigned_short>::Iterator::operator*(&local_6e);
      WireHelpers::copyPointer
                (this->segment,this->capTable,this->pointers + (int)(uint)*puVar3,other.segment,
                 other.capTable,other.pointers + (int)(uint)*puVar3,other.nestingLimit,
                 (BuilderArena *)0x0,false);
      kj::Range<unsigned_short>::Iterator::operator++(&local_6e);
    }
  }
  else {
    local_99 = true;
    if (local_14 != 0) {
      local_99 = other.data == this->data;
    }
    f.exception._7_1_ = local_99;
    local_18 = (DebugExpression)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&f.exception + 7));
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool(&local_18);
    local_9a = false;
    if (bVar1) {
      local_9b = true;
      if (local_16 != 0) {
        local_9b = other.pointers == this->pointers;
      }
      local_9a = local_9b;
    }
    local_17 = local_9a;
    if (local_9a == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                (&local_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xb62,FAILED,
                 "(sharedDataSize == ZERO * BITS || other.data == data) && (sharedPointerCount == ZERO * POINTERS || other.pointers == pointers)"
                 ,"_kjCondition,",&local_17);
      kj::_::Debug::Fault::fatal(&local_28);
    }
  }
  return;
}

Assistant:

void StructBuilder::copyContentFrom(StructReader other) {
  // Determine the amount of data the builders have in common.
  auto sharedDataSize = kj::min(dataSize, other.dataSize);
  auto sharedPointerCount = kj::min(pointerCount, other.pointerCount);

  if ((sharedDataSize > ZERO * BITS && other.data == data) ||
      (sharedPointerCount > ZERO * POINTERS && other.pointers == pointers)) {
    // At least one of the section pointers is pointing to ourself. Verify that the other is two
    // (but ignore empty sections).
    KJ_ASSERT((sharedDataSize == ZERO * BITS || other.data == data) &&
              (sharedPointerCount == ZERO * POINTERS || other.pointers == pointers));
    // So `other` appears to be a reader for this same struct. No coping is needed.
    return;
  }

  if (dataSize > sharedDataSize) {
    // Since the target is larger than the source, make sure to zero out the extra bits that the
    // source doesn't have.
    if (dataSize == ONE * BITS) {
      setDataField<bool>(ZERO * ELEMENTS, false);
    } else {
      byte* unshared = reinterpret_cast<byte*>(data) + sharedDataSize / BITS_PER_BYTE;
      WireHelpers::zeroMemory(unshared,
          subtractChecked(dataSize, sharedDataSize, []() {}) / BITS_PER_BYTE);
    }
  }

  // Copy over the shared part.
  if (sharedDataSize == ONE * BITS) {
    setDataField<bool>(ZERO * ELEMENTS, other.getDataField<bool>(ZERO * ELEMENTS));
  } else {
    WireHelpers::copyMemory(reinterpret_cast<byte*>(data),
                            reinterpret_cast<const byte*>(other.data),
                            sharedDataSize / BITS_PER_BYTE);
  }

  // Zero out all pointers in the target.
  for (auto i: kj::zeroTo(pointerCount)) {
    WireHelpers::zeroObject(segment, capTable, pointers + i);
  }
  WireHelpers::zeroMemory(pointers, pointerCount);

  // Copy the pointers.
  for (auto i: kj::zeroTo(sharedPointerCount)) {
    WireHelpers::copyPointer(segment, capTable, pointers + i,
        other.segment, other.capTable, other.pointers + i, other.nestingLimit);
  }
}